

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor,Options *options)

{
  bool bVar1;
  bool in_CL;
  Options *options_local;
  EnumDescriptor *descriptor_local;
  EnumGenerator *this_local;
  
  this->descriptor_ = descriptor;
  ClassName_abi_cxx11_(&this->classname_,(cpp *)descriptor,(EnumDescriptor *)0x0,in_CL);
  this->options_ = options;
  bVar1 = anon_unknown_2::ShouldGenerateArraySize(descriptor);
  this->generate_array_size_ = bVar1;
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor,
                             const Options& options)
  : descriptor_(descriptor),
    classname_(ClassName(descriptor, false)),
    options_(options),
    generate_array_size_(ShouldGenerateArraySize(descriptor)) {
}